

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sndio.cpp
# Opt level: O0

int __thiscall
anon_unknown.dwarf_238a35::SndioPlayback::open(SndioPlayback *this,char *__file,int __oflag,...)

{
  int iVar1;
  sio_hdl *psVar2;
  backend_exception *pbVar3;
  char *local_10;
  
  if (__file == (char *)0x0) {
    local_10 = "SndIO Default";
  }
  else {
    iVar1 = strcmp(__file,"SndIO Default");
    local_10 = __file;
    if (iVar1 != 0) {
      pbVar3 = (backend_exception *)__cxa_allocate_exception(0x30);
      al::backend_exception::backend_exception(pbVar3,0xa004,"Device name \"%s\" not found",__file);
      __cxa_throw(pbVar3,&al::backend_exception::typeinfo,al::backend_exception::~backend_exception)
      ;
    }
  }
  psVar2 = (sio_hdl *)sio_open(0,1,0);
  this->mSndHandle = psVar2;
  if (this->mSndHandle != (sio_hdl *)0x0) {
    iVar1 = std::__cxx11::string::operator=
                      ((string *)&((this->super_BackendBase).mDevice)->DeviceName,local_10);
    return iVar1;
  }
  pbVar3 = (backend_exception *)__cxa_allocate_exception(0x30);
  al::backend_exception::backend_exception(pbVar3,0xa004,"Could not open backend device");
  __cxa_throw(pbVar3,&al::backend_exception::typeinfo,al::backend_exception::~backend_exception);
}

Assistant:

void SndioPlayback::open(const ALCchar *name)
{
    if(!name)
        name = sndio_device;
    else if(strcmp(name, sndio_device) != 0)
        throw al::backend_exception{ALC_INVALID_VALUE, "Device name \"%s\" not found", name};

    mSndHandle = sio_open(nullptr, SIO_PLAY, 0);
    if(mSndHandle == nullptr)
        throw al::backend_exception{ALC_INVALID_VALUE, "Could not open backend device"};

    mDevice->DeviceName = name;
}